

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Ramp.cpp
# Opt level: O2

void __thiscall chrono::ChFunction_Ramp::ArchiveOUT(ChFunction_Ramp *this,ChArchiveOut *marchive)

{
  ChNameValue<double> local_48;
  ChNameValue<double> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChFunction_Ramp>(marchive);
  ChFunction::ArchiveOUT(&this->super_ChFunction,marchive);
  local_30._value = &this->y0;
  local_30._name = "y0";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->ang;
  local_48._name = "ang";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  return;
}

Assistant:

void ChFunction_Ramp::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChFunction_Ramp>();
    // serialize parent class
    ChFunction::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(y0);
    marchive << CHNVP(ang);
}